

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O1

int kws_search_step(ps_search_t *search,int frame_idx)

{
  int32 *piVar1;
  uint uVar2;
  acmod_t *acmod;
  long lVar3;
  undefined8 *puVar4;
  int32 iVar5;
  _func_int_ps_search_t_ptr *p_Var6;
  dict2pid_t *pdVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  dict2pid_t *pdVar13;
  long lVar14;
  int local_34;
  
  acmod = search->acmod;
  if (acmod->compallsen == '\0') {
    acmod_clear_active(acmod);
    if (0 < *(int *)&search[1].dict) {
      lVar14 = 0;
      lVar11 = 0;
      do {
        acmod_activate_hmm(search->acmod,(hmm_t *)((long)&(search[1].d2p)->refcount + lVar14));
        lVar11 = lVar11 + 1;
        lVar14 = lVar14 + 0x58;
      } while (lVar11 < *(int *)&search[1].dict);
    }
    for (plVar12 = (long *)search[1].type; plVar12 != (long *)0x0; plVar12 = (long *)plVar12[1]) {
      lVar11 = *plVar12;
      if (0 < *(int *)(lVar11 + 0x18)) {
        lVar10 = 0;
        lVar14 = 0;
        do {
          if (0 < *(int *)(*(long *)(lVar11 + 0x10) + 0x4c + lVar10)) {
            acmod_activate_hmm(search->acmod,(hmm_t *)(*(long *)(lVar11 + 0x10) + lVar10));
          }
          lVar14 = lVar14 + 1;
          lVar10 = lVar10 + 0x58;
        } while (lVar14 < *(int *)(lVar11 + 0x18));
      }
    }
  }
  p_Var6 = (_func_int_ps_search_t_ptr *)acmod_score(acmod,&local_34);
  (search[1].vt)->finish = p_Var6;
  if (*(int *)&search[1].dict < 1) {
    iVar8 = -0x20000000;
  }
  else {
    iVar8 = -0x20000000;
    lVar11 = 0;
    lVar14 = 0;
    do {
      iVar5 = hmm_vit_eval((hmm_t *)((long)&(search[1].d2p)->refcount + lVar11));
      if (iVar8 < iVar5) {
        iVar8 = iVar5;
      }
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x58;
    } while (lVar14 < *(int *)&search[1].dict);
  }
  for (plVar12 = (long *)search[1].type; plVar12 != (long *)0x0; plVar12 = (long *)plVar12[1]) {
    lVar11 = *plVar12;
    if (0 < *(int *)(lVar11 + 0x18)) {
      lVar14 = 0;
      lVar10 = 0;
      do {
        if ((0 < *(int *)(*(long *)(lVar11 + 0x10) + 0x4c + lVar14)) &&
           (iVar5 = hmm_vit_eval((hmm_t *)(*(long *)(lVar11 + 0x10) + lVar14)), iVar8 < iVar5)) {
          iVar8 = iVar5;
        }
        lVar10 = lVar10 + 1;
        lVar14 = lVar14 + 0x58;
      } while (lVar10 < *(int *)(lVar11 + 0x18));
    }
  }
  *(int *)((long)&search[1].config + 4) = iVar8;
  plVar12 = (long *)search[1].type;
  if (plVar12 != (long *)0x0) {
    iVar9 = *(int *)((long)&search[1].pls + 4);
    do {
      lVar11 = *plVar12;
      if (0 < *(int *)(lVar11 + 0x18)) {
        lVar14 = 0;
        lVar10 = 0;
        do {
          lVar3 = *(long *)(lVar11 + 0x10);
          if ((0 < *(int *)(lVar3 + 0x4c + lVar14)) &&
             (*(int *)(lVar3 + 0x44 + lVar14) < iVar8 + iVar9)) {
            hmm_clear((hmm_t *)(lVar3 + lVar14));
          }
          lVar10 = lVar10 + 1;
          lVar14 = lVar14 + 0x58;
        } while (lVar10 < *(int *)(lVar11 + 0x18));
      }
      plVar12 = (long *)plVar12[1];
    } while (plVar12 != (long *)0x0);
  }
  lVar11 = (long)*(int *)&search[1].dict;
  if (lVar11 < 1) {
    pdVar13 = (dict2pid_t *)0x0;
  }
  else {
    pdVar7 = search[1].d2p;
    iVar8 = -0x20000000;
    pdVar13 = (dict2pid_t *)0x0;
    do {
      if (iVar8 < *(int *)&pdVar7->lrssid) {
        pdVar13 = pdVar7;
        iVar8 = *(int *)&pdVar7->lrssid;
      }
      pdVar7 = (dict2pid_t *)&pdVar7[1].rssid;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  if (pdVar13 != (dict2pid_t *)0x0) {
    for (plVar12 = (long *)search[1].type; plVar12 != (long *)0x0; plVar12 = (long *)plVar12[1]) {
      puVar4 = (undefined8 *)*plVar12;
      if (0 < (long)*(int *)(puVar4 + 3)) {
        lVar11 = (long)*(int *)(puVar4 + 3) * 0x58;
        if ((0 < *(int *)(puVar4[2] + -0xc + lVar11)) && (-0x20000000 < *(int *)&pdVar13->lrssid)) {
          lVar11 = puVar4[2] + lVar11;
          iVar8 = *(int *)(lVar11 + -0x28);
          iVar9 = iVar8 - *(int *)&pdVar13->lrssid;
          if (*(int *)(puVar4 + 1) <= iVar9) {
            kws_detections_add((kws_detections_t *)search[1].name,(char *)*puVar4,
                               *(int *)(lVar11 + -0x24),*(int *)&search[1].pls,iVar9 + -0x5dc,iVar8)
            ;
          }
        }
      }
    }
    if (0 < *(int *)&search[1].dict) {
      lVar14 = 0;
      lVar11 = 0;
      do {
        iVar8 = *(int *)&search[1].config + *(int *)&pdVar13->lrssid;
        if (*(int *)((long)&(search[1].d2p)->mdef + lVar14) < iVar8) {
          hmm_enter((hmm_t *)((long)&(search[1].d2p)->refcount + lVar14),iVar8,
                    *(int32 *)((long)&pdVar13->lrssid + 4),*(int *)&search[1].pls + 1);
        }
        lVar11 = lVar11 + 1;
        lVar14 = lVar14 + 0x58;
      } while (lVar11 < *(int *)&search[1].dict);
    }
    for (plVar12 = (long *)search[1].type; plVar12 != (long *)0x0; plVar12 = (long *)plVar12[1]) {
      lVar11 = *plVar12;
      uVar2 = *(uint *)(lVar11 + 0x18);
      if (0 < (int)uVar2) {
        if (uVar2 != 1) {
          lVar10 = (ulong)uVar2 + 1;
          lVar14 = (ulong)uVar2 * 0x58 + -0x80;
          do {
            lVar3 = *(long *)(lVar11 + 0x10);
            if ((0 < *(int *)(lVar3 + 0x1c + lVar14)) &&
               ((*(int *)(lVar3 + 0x74 + lVar14) < 1 ||
                (*(int *)(lVar3 + 0x30 + lVar14) < *(int *)(lVar3 + lVar14))))) {
              piVar1 = (int32 *)(lVar3 + lVar14);
              hmm_enter((hmm_t *)(piVar1 + 10),*piVar1,piVar1[1],*(int *)&search[1].pls + 1);
            }
            lVar10 = lVar10 + -1;
            lVar14 = lVar14 + -0x58;
          } while (2 < lVar10);
        }
        if ((*(hmm_t **)(lVar11 + 0x10))->score[0] < *(int32 *)&pdVar13->lrssid) {
          hmm_enter(*(hmm_t **)(lVar11 + 0x10),*(int32 *)&pdVar13->lrssid,*(int *)&search[1].pls,
                    *(int *)&search[1].pls + 1);
        }
      }
    }
  }
  *(int *)&search[1].pls = *(int *)&search[1].pls + 1;
  return 0;
}

Assistant:

int
kws_search_step(ps_search_t * search, int frame_idx)
{
    int16 const *senscr;
    kws_search_t *kwss = (kws_search_t *) search;
    acmod_t *acmod = search->acmod;

    /* Activate senones */
    if (!acmod->compallsen)
        kws_search_sen_active(kwss);

    /* Calculate senone scores for current frame. */
    senscr = acmod_score(acmod, &frame_idx);

    /* Evaluate hmms in phone loop and in active keyphrase nodes */
    kws_search_hmm_eval(kwss, senscr);

    /* Prune hmms with low prob */
    kws_search_hmm_prune(kwss);

    /* Do hmms transitions */
    kws_search_trans(kwss);

    ++kwss->frame;
    return 0;
}